

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationLimitsTests.cpp
# Opt level: O2

TestStatus *
vkt::tessellation::anon_unknown_1::deviceLimitsTestCase
          (TestStatus *__return_storage_ptr__,Context *context,LimitsCaseDefinition caseDef)

{
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  NotSupportedError *this;
  allocator<char> local_469;
  string local_468;
  VkPhysicalDeviceProperties properties;
  VkPhysicalDeviceFeatures features;
  
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceFeatures(&features,vk,physicalDevice);
  if (features.tessellationShader != 0) {
    ::vk::getPhysicalDeviceProperties(&properties,vk,physicalDevice);
    if (caseDef.limitType < 8) {
      switch((ulong)caseDef & 0xffffffff) {
      case 0:
        properties.limits.maxTessellationEvaluationOutputComponents =
             properties.limits.maxTessellationGenerationLevel;
        break;
      case 1:
        properties.limits.maxTessellationEvaluationOutputComponents =
             properties.limits.maxTessellationPatchSize;
        break;
      case 2:
        properties.limits.maxTessellationEvaluationOutputComponents =
             properties.limits.maxTessellationControlPerVertexInputComponents;
        break;
      case 3:
        properties.limits.maxTessellationEvaluationOutputComponents =
             properties.limits.maxTessellationControlPerVertexOutputComponents;
        break;
      case 4:
        properties.limits.maxTessellationEvaluationOutputComponents =
             properties.limits.maxTessellationControlPerPatchOutputComponents;
        break;
      case 5:
        properties.limits.maxTessellationEvaluationOutputComponents =
             properties.limits.maxTessellationControlTotalOutputComponents;
        break;
      case 6:
        properties.limits.maxTessellationEvaluationOutputComponents =
             properties.limits.maxTessellationEvaluationInputComponents;
        break;
      case 7:
      }
      expectGreaterOrEqual
                (__return_storage_ptr__,context->m_testCtx->m_log,caseDef.minimum,
                 properties.limits.maxTessellationEvaluationOutputComponents);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_468,"Test error",&local_469);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_468);
      std::__cxx11::string::~string((string *)&local_468);
    }
    return __return_storage_ptr__;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&properties,"Tessellation shader not supported",(allocator<char> *)&local_468
            );
  tcu::NotSupportedError::NotSupportedError(this,(string *)&properties);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus deviceLimitsTestCase(Context& context, const LimitsCaseDefinition caseDef)
{
	const InstanceInterface&		vki			= context.getInstanceInterface();
	const VkPhysicalDevice			physDevice	= context.getPhysicalDevice();
	const VkPhysicalDeviceFeatures	features	= getPhysicalDeviceFeatures(vki, physDevice);

	if (!features.tessellationShader)
		throw tcu::NotSupportedError("Tessellation shader not supported");

	const VkPhysicalDeviceProperties properties = getPhysicalDeviceProperties(vki, physDevice);
	tcu::TestLog&					 log		= context.getTestContext().getLog();

	switch (caseDef.limitType)
	{
		case LIMIT_MAX_TESSELLATION_GENERATION_LEVEL:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationGenerationLevel);
		case LIMIT_MAX_TESSELLATION_PATCH_SIZE:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationPatchSize);
		case LIMIT_MAX_TESSELLATION_CONTROL_PER_VERTEX_INPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlPerVertexInputComponents);
		case LIMIT_MAX_TESSELLATION_CONTROL_PER_VERTEX_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlPerVertexOutputComponents);
		case LIMIT_MAX_TESSELLATION_CONTROL_PER_PATCH_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlPerPatchOutputComponents);
		case LIMIT_MAX_TESSELLATION_CONTROL_TOTAL_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationControlTotalOutputComponents);
		case LIMIT_MAX_TESSELLATION_EVALUATION_INPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationEvaluationInputComponents);
		case LIMIT_MAX_TESSELLATION_EVALUATION_OUTPUT_COMPONENTS:
			return expectGreaterOrEqual(log, caseDef.minimum, properties.limits.maxTessellationEvaluationOutputComponents);
	}

	// Control should never get here.
	DE_FATAL("Internal test error");
	return tcu::TestStatus::fail("Test error");
}